

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCursesMainForm.cxx
# Opt level: O1

void __thiscall cmCursesMainForm::PrintKeys(cmCursesMainForm *this,int process)

{
  FORM *form;
  int iVar1;
  FIELD *field;
  long *plVar2;
  size_t sVar3;
  char *pcVar4;
  char *__src;
  int iVar5;
  char firstLine [512];
  char fmt [512];
  char thirdLine [512];
  char secondLine [512];
  char local_828 [512];
  char local_628 [512];
  char local_428 [512];
  char local_228 [512];
  
  iVar1 = -1;
  iVar5 = -1;
  if (_stdscr != 0) {
    iVar5 = *(short *)(_stdscr + 4) + 1;
    iVar1 = *(short *)(_stdscr + 6) + 1;
  }
  if (((0x40 < iVar1) && (this->InitialWidth <= iVar1)) && (5 < iVar5)) {
    form = (this->super_cmCursesForm).Form;
    if (form == (FORM *)0x0) {
      plVar2 = (long *)0x0;
    }
    else {
      field = current_field((FORM_conflict *)form);
      plVar2 = (long *)field_userptr(field);
    }
    if (plVar2 != (long *)0x0) {
      (**(code **)(*plVar2 + 0x30))(plVar2);
    }
    memset(local_828,0,0x200);
    memset(local_228,0,0x200);
    memset(local_428,0,0x200);
    if (process == 0) {
      if (this->OkToGenerate == true) {
        builtin_strncpy(local_828 + 0x30,"te and exit",0xc);
        builtin_strncpy(local_828 + 0x20,"ss [g] to genera",0x10);
        builtin_strncpy(local_828 + 0x18,"     Pre",8);
      }
      else {
        builtin_strncpy(local_828 + 0x30,"         ",10);
        builtin_strncpy(local_828 + 0x20,"                ",0x10);
        builtin_strncpy(local_828 + 0x18,"        ",8);
      }
      builtin_strncpy(local_828,"Press [c] to configure  ",0x18);
      pcVar4 = "Off";
      if (this->AdvancedMode != false) {
        pcVar4 = "On";
      }
      sprintf(local_428,"Press [t] to toggle advanced mode (Currently %s)",pcVar4);
      __src = "Press [h] for help           Press [q] to quit without generating";
      pcVar4 = local_228;
      sVar3 = 0x42;
    }
    else {
      memcpy(local_828,"                                                                    ",0x45);
      memcpy(local_228,"                                                                    ",0x45);
      pcVar4 = local_428;
      sVar3 = 0x45;
      __src = "                                                                    ";
    }
    memcpy(pcVar4,__src,sVar3);
    move(iVar5 + -4,0);
    memcpy(local_628,"Press [enter] to edit option",0x200);
    if (process != 0) {
      builtin_strncpy(local_628 + 0x14,"       ",8);
      builtin_strncpy(local_628,"                    ",0x14);
    }
    printw(local_628);
    move(iVar5 + -3,0);
    printw(local_828);
    move(iVar5 + -2,0);
    printw(local_228);
    move(iVar5 + -1,0);
    printw(local_428);
    if (plVar2 != (long *)0x0) {
      sprintf(local_828,"Page %d of %d",(ulong)*(uint *)(plVar2 + 7),
              (ulong)(uint)this->NumberOfPages);
      sVar3 = strlen(local_828);
      move(0,0x40 - (int)sVar3);
      printw(local_828);
    }
    pos_form_cursor((FORM_conflict *)(this->super_cmCursesForm).Form);
  }
  return;
}

Assistant:

void cmCursesMainForm::PrintKeys(int process /* = 0 */)
{
  int x,y;
  getmaxyx(stdscr, y, x);
  if ( x < cmCursesMainForm::MIN_WIDTH  ||
       x < this->InitialWidth               ||
       y < cmCursesMainForm::MIN_HEIGHT )
    {
    return;
    }

  // Give the current widget (if it exists), a chance to print keys
  cmCursesWidget* cw = 0;
  if (this->Form)
    {
    FIELD* currentField = current_field(this->Form);
    cw = reinterpret_cast<cmCursesWidget*>(field_userptr(currentField));
    }

  if (cw)
    {
    cw->PrintKeys();
    }

//    {
//    }
//  else
//    {
  char firstLine[512]="";
  char secondLine[512]="";
  char thirdLine[512]="";
  if (process)
    {
    const char* clearLine =
      "                                                                    ";
    strcpy(firstLine, clearLine);
    strcpy(secondLine, clearLine);
    strcpy(thirdLine, clearLine);
    }
  else
    {
    if (this->OkToGenerate)
      {
      sprintf(firstLine,
              "Press [c] to configure       Press [g] to generate and exit");
      }
    else
      {
      sprintf(firstLine,  "Press [c] to configure                                   ");
      }
    {
      const char* toggleKeyInstruction =
        "Press [t] to toggle advanced mode (Currently %s)";
      sprintf(thirdLine,
              toggleKeyInstruction,
              this->AdvancedMode ? "On" : "Off");
    }
    sprintf(secondLine,
            "Press [h] for help           "
            "Press [q] to quit without generating");
    }

  curses_move(y-4,0);
  char fmt[512] = "Press [enter] to edit option";
  if ( process )
    {
    strcpy(fmt, "                           ");
    }
  printw(fmt);
  curses_move(y-3,0);
  printw(firstLine);
  curses_move(y-2,0);
  printw(secondLine);
  curses_move(y-1,0);
  printw(thirdLine);

  if (cw)
    {
    sprintf(firstLine, "Page %d of %d", cw->GetPage(), this->NumberOfPages);
    curses_move(0,65-static_cast<unsigned int>(strlen(firstLine))-1);
    printw(firstLine);
    }
//    }

  pos_form_cursor(this->Form);

}